

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qreadwritelock.cpp
# Opt level: O1

void __thiscall QReadWriteLockPrivate::release(QReadWriteLockPrivate *this)

{
  int iVar1;
  __pointer_type pQVar2;
  ulong uVar3;
  uint uVar4;
  Type *pTVar5;
  int *piVar6;
  uint uVar7;
  uint uVar8;
  ulong uVar9;
  ulong in_R8;
  uint uVar10;
  uint uVar11;
  bool bVar12;
  
  pTVar5 = QGlobalStatic<QtGlobalStatic::Holder<(anonymous_namespace)::(anonymous_namespace)::Q_QGS_qrwl_freelist>_>
           ::instance();
  uVar7 = this->id & 0xffffff;
  piVar6 = &(anonymous_namespace)::QReadWriteLockFreeListConstants::Sizes;
  uVar9 = 0;
  uVar8 = uVar7;
  uVar10 = uVar7;
  do {
    iVar1 = *piVar6;
    uVar11 = uVar10 - iVar1;
    uVar3 = in_R8;
    uVar4 = uVar11;
    if ((int)uVar10 < iVar1) {
      uVar3 = uVar9;
      uVar4 = uVar8;
      uVar11 = uVar10;
    }
    uVar8 = uVar4;
    in_R8 = uVar3 & 0xffffffff;
    if ((int)uVar10 < iVar1) break;
    piVar6 = piVar6 + 1;
    bVar12 = uVar9 != 3;
    uVar9 = uVar9 + 1;
    uVar10 = uVar11;
  } while (bVar12);
  pQVar2 = pTVar5->_v[(int)uVar3].
           super_QBasicAtomicPointer<QFreeListElement<QReadWriteLockPrivate>_>._q_value._M_b._M_p;
  do {
    uVar10 = (pTVar5->_next).super_QAtomicInteger<int>.super_QBasicAtomicInteger<int>._q_value.
             super___atomic_base<int>._M_i;
    pQVar2[(int)uVar8].next.super_QAtomicInteger<int>.super_QBasicAtomicInteger<int>._q_value =
         (Type)(uVar10 & 0xffffff);
    LOCK();
    bVar12 = uVar10 == (pTVar5->_next).super_QAtomicInteger<int>.super_QBasicAtomicInteger<int>.
                       _q_value.super___atomic_base<int>._M_i;
    if (bVar12) {
      (pTVar5->_next).super_QAtomicInteger<int>.super_QBasicAtomicInteger<int>._q_value.
      super___atomic_base<int>._M_i = uVar10 + 0x1000000 & 0x7f000000 | uVar7;
    }
    UNLOCK();
  } while (!bVar12);
  return;
}

Assistant:

void QReadWriteLockPrivate::release()
{
    Q_ASSERT(!recursive);
    Q_ASSERT(!waitingReaders && !waitingWriters && !readerCount && !writerCount);
    qrwl_freelist->release(id);
}